

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_Surface::IsCylinder(ON_Surface *this,ON_Cylinder *cylinder,double tolerance)

{
  double *pdVar1;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar2;
  int iVar3;
  ON_RevSurface *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ON_RevSurface *local_348;
  ON_RevSurface *local_330;
  ON_RevSurface *local_2f0;
  ON_RevSurface *local_2d8;
  bool local_2c1;
  ON_3dPoint local_2a0;
  ON_3dPoint local_288;
  uint local_270;
  int local_26c;
  int jj;
  int j;
  int ii;
  int i;
  double *t;
  double *s;
  int sc1;
  int sc0;
  double v;
  double u;
  ON_3dPoint P;
  ON_3dPoint local_200;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  ON_3dPoint local_1d0;
  double local_1b8;
  double r;
  double tol;
  double local_1a0;
  double local_198;
  ON_3dPoint local_190;
  ON_Interval local_178;
  int local_164;
  ON_3dPoint local_160;
  ON_3dPoint local_148;
  uint local_12c;
  uint local_128;
  int bIsArc;
  int bIsLine;
  undefined1 auStack_118 [8];
  ON_Line line;
  ON_Arc arc;
  ON_Curve *crv;
  bool rc;
  ON_RevSurface *rs;
  double tolerance_local;
  ON_Cylinder *cylinder_local;
  ON_Surface *this_local;
  ON_Curve *pOVar4;
  
  bVar2 = ON_IsValid(tolerance);
  if ((!bVar2) || (rs = (ON_RevSurface *)tolerance, tolerance <= 0.0)) {
    rs = (ON_RevSurface *)0x3df0000000000000;
  }
  this_00 = ON_RevSurface::Cast((ON_Object *)this);
  local_2c1 = false;
  if (this_00 != (ON_RevSurface *)0x0) {
    local_2c1 = ON_RevSurface::IsCylindrical(this_00,cylinder,(double)rs);
  }
  crv._7_1_ = local_2c1;
  if ((local_2c1 == false) && (this_00 == (ON_RevSurface *)0x0)) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
    ON_Interval::Mid((ON_Interval *)(arc.m_angle.m_t + 1));
    iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,0);
    pOVar4 = (ON_Curve *)CONCAT44(extraout_var,iVar3);
    if (pOVar4 == (ON_Curve *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_00829059;
    }
    ON_Arc::ON_Arc((ON_Arc *)&line.to.z);
    ON_Line::ON_Line((ON_Line *)auStack_118);
    local_128 = 0;
    uVar6 = 0;
    uVar7 = 0x3df00000;
    if ((double)rs <= 2.3283064365386963e-10) {
      local_2d8 = (ON_RevSurface *)0x0;
    }
    else {
      local_2d8 = rs;
    }
    iVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                      (local_2d8,pOVar4,0,&line.to.z);
    local_12c = (uint)((byte)iVar3 & 1);
    if (local_12c == 0) {
      uVar6 = 0;
      uVar7 = 0x3df00000;
      if ((double)rs <= 2.3283064365386963e-10) {
        local_2f0 = (ON_RevSurface *)0x0;
      }
      else {
        local_2f0 = rs;
      }
      iVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(local_2f0);
      local_128 = (uint)((byte)iVar3 & 1);
      if (local_128 != 0) {
        ON_Curve::PointAtStart(&local_148,pOVar4);
        line.from.y = local_148.z;
        auStack_118 = (undefined1  [8])local_148.x;
        line.from.x = local_148.y;
        ON_Curve::PointAtEnd(&local_160,pOVar4);
        line.from.z = local_160.x;
        line.to.x = local_160.y;
        line.to.y = local_160.z;
      }
    }
    if (pOVar4 != (ON_Curve *)0x0) {
      (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    if ((local_12c == 0) && (local_128 == 0)) {
      this_local._7_1_ = 0;
      local_164 = 1;
    }
    else {
      (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
      local_178.m_t[1] = (double)CONCAT44(uVar7,uVar6);
      dVar5 = ON_Interval::Mid(&local_178);
      iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(dVar5,this,1);
      pOVar4 = (ON_Curve *)CONCAT44(extraout_var_00,iVar3);
      if (pOVar4 == (ON_Curve *)0x0) {
        this_local._7_1_ = 0;
        local_164 = 1;
      }
      else {
        if (local_12c == 0) {
          if ((double)rs <= 2.3283064365386963e-10) {
            local_330 = (ON_RevSurface *)0x0;
          }
          else {
            local_330 = rs;
          }
          iVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                            (local_330,pOVar4,0,&line.to.z);
          local_12c = (uint)((byte)iVar3 & 1);
        }
        else if (local_128 == 0) {
          if ((double)rs <= 2.3283064365386963e-10) {
            local_348 = (ON_RevSurface *)0x0;
          }
          else {
            local_348 = rs;
          }
          iVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(local_348);
          local_128 = (uint)((byte)iVar3 & 1);
          if (local_128 != 0) {
            ON_Curve::PointAtStart(&local_190,pOVar4);
            line.from.y = local_190.z;
            auStack_118 = (undefined1  [8])local_190.x;
            line.from.x = local_190.y;
            ON_Curve::PointAtEnd((ON_3dPoint *)&tol,pOVar4);
            line.from.z = tol;
            line.to.x = local_1a0;
            line.to.y = local_198;
          }
        }
        if (pOVar4 != (ON_Curve *)0x0) {
          (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        if ((local_12c == 0) || (local_128 == 0)) {
          this_local._7_1_ = 0;
          local_164 = 1;
        }
        else {
          r = arc.super_ON_Circle.plane.plane_equation.d * 7.450580596925e-09;
          if (r < (double)rs) {
            r = (double)rs;
          }
          pdVar1 = &line.to.z;
          local_1d8 = line.from.y;
          local_1e8 = (double)auStack_118;
          dStack_1e0 = line.from.x;
          p.y = line.from.x;
          p.x = (double)auStack_118;
          p.z = line.from.y;
          ON_Plane::ClosestPointTo(&local_1d0,(ON_Plane *)pdVar1,p);
          local_1b8 = ON_3dPoint::DistanceTo((ON_3dPoint *)pdVar1,&local_1d0);
          if (ABS(arc.super_ON_Circle.plane.plane_equation.d - local_1b8) <= r) {
            pdVar1 = &line.to.z;
            p_00.y = line.to.x;
            p_00.x = line.from.z;
            p_00.z = line.to.y;
            ON_Plane::ClosestPointTo(&local_200,(ON_Plane *)pdVar1,p_00);
            local_1b8 = ON_3dPoint::DistanceTo((ON_3dPoint *)pdVar1,&local_200);
            if (ABS(arc.super_ON_Circle.plane.plane_equation.d - local_1b8) <= r) {
              s._4_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
              s._0_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
              t = (double *)onmalloc((long)(s._4_4_ + (int)s) * 8 + 0x10);
              _ii = t + (long)s._4_4_ + 1;
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,t);
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1,_ii);
              for (j = 0; j < s._4_4_; j = j + 1) {
                for (jj = (int)(j != 0); jj < 5; jj = jj + 1) {
                  v = ((double)(4 - jj) * t[j] + (double)jj * t[j + 1]) * 0.25;
                  for (local_26c = 0; local_26c < (int)s; local_26c = local_26c + 1) {
                    for (local_270 = (uint)(local_26c != 0); (int)local_270 < 5;
                        local_270 = local_270 + 1) {
                      _sc1 = ((double)(int)(4 - local_270) * _ii[local_26c] +
                             (double)(int)local_270 * _ii[(long)local_26c + 1]) * 0.25;
                      PointAt(&local_288,this,v,_sc1);
                      P.y = local_288.z;
                      u = local_288.x;
                      P.x = local_288.y;
                      pdVar1 = &line.to.z;
                      p_01.y = local_288.y;
                      p_01.x = local_288.x;
                      p_01.z = local_288.z;
                      ON_Plane::ClosestPointTo(&local_2a0,(ON_Plane *)pdVar1,p_01);
                      local_1b8 = ON_3dPoint::DistanceTo((ON_3dPoint *)pdVar1,&local_2a0);
                      if (r < ABS(arc.super_ON_Circle.plane.plane_equation.d - local_1b8)) {
                        onfree(t);
                        this_local._7_1_ = 0;
                        local_164 = 1;
                        goto LAB_0082901b;
                      }
                    }
                  }
                }
              }
              onfree(t);
              crv._7_1_ = true;
              if (cylinder != (ON_Cylinder *)0x0) {
                ON_Cylinder::Create(cylinder,(ON_Circle *)&line.to.z);
                crv._7_1_ = ON_Cylinder::IsValid(cylinder);
              }
              local_164 = 0;
            }
            else {
              this_local._7_1_ = 0;
              local_164 = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            local_164 = 1;
          }
        }
      }
    }
LAB_0082901b:
    ON_Line::~ON_Line((ON_Line *)auStack_118);
    ON_Arc::~ON_Arc((ON_Arc *)&line.to.z);
    if (local_164 != 0) goto LAB_00829059;
  }
  this_local._7_1_ = crv._7_1_;
LAB_00829059:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_Surface::IsCylinder( ON_Cylinder* cylinder, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  bool rc = rs && rs->IsCylindrical(cylinder,tolerance);

  if ( !rc && !rs )
  {
    ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
    if ( !crv )
      return false;

    ON_Arc arc;
    ON_Line line;
    int bIsLine = 0;
    int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( !bIsArc )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc && !bIsLine )
      return false;

    crv = IsoCurve(1,Domain(0).Mid());
    if ( !crv )
      return false;
    if ( !bIsArc )
      bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    else if ( !bIsLine )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc || !bIsLine )
      return false;

    double tol = 0.5*ON_SQRT_EPSILON*(arc.radius);
    if ( tol < tolerance )
      tol = tolerance;
    double r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
    if ( fabs(arc.radius - r) > tol )
      return false;
    r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
    if ( fabs(arc.radius - r) > tol )
      return false;

    ON_3dPoint P;
    double u, v;
    int sc0 = SpanCount(0);
    int sc1 = SpanCount(1);
    double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
    double* t = s + (sc0+1);
    GetSpanVector(0,s);
    GetSpanVector(1,t);
    for ( int i = 0; i < sc0; i++ )
    {
      for ( int ii = i?1:0; ii <= 4; ii++ )
      {
        u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
        for ( int j = 0; j < sc1; j++ )
        {
          for ( int jj = j?1:0; jj <= 4; jj++ )
          {
            v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
            P = PointAt(u,v);
            r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(P));
            if ( fabs(arc.radius - r) > tol )
            {
              onfree(s);
              return false;
            }
          }
        }
      }
    }
    onfree(s);


    rc = true;
    if ( cylinder )
    {
      cylinder->Create(arc);
      rc = cylinder->IsValid();
    }
  }

  return rc;
}